

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  stack_st_SRTP_PROTECTION_PROFILE *sk;
  uint8_t *data;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> other;
  ushort local_aa;
  undefined1 local_a8 [6];
  uint16_t profile_id;
  CBS profile_ids_tmp;
  SRTP_PROTECTION_PROFILE *server_profile;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __end1;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  stack_st_SRTP_PROTECTION_PROFILE **__range1;
  stack_st_SRTP_PROTECTION_PROFILE *server_profiles;
  CBS srtp_mki;
  CBS profile_ids;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = (SSL *)hs->ssl;
  if ((contents == (CBS *)0x0) || (iVar2 = SSL_is_dtls((SSL *)ssl_00), iVar2 == 0)) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBS_get_u16_length_prefixed(contents,(CBS *)&srtp_mki.len);
    if ((((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&srtp_mki.len), sVar3 < 2)) ||
        (iVar2 = CBS_get_u8_length_prefixed(contents,(CBS *)&server_profiles), iVar2 == 0)) ||
       (sVar3 = CBS_len(contents), sVar3 != 0)) {
      ERR_put_error(0x10,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x6c3);
      hs_local._7_1_ = false;
    }
    else {
      sk = (stack_st_SRTP_PROTECTION_PROFILE *)SSL_get_srtp_profiles(ssl_00);
      join_0x00000010_0x00000000_ = begin<stack_st_SRTP_PROTECTION_PROFILE>(sk);
      other = end<stack_st_SRTP_PROTECTION_PROFILE>(sk);
      while (bVar1 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator!=
                               ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_,
                                other), bVar1) {
        profile_ids_tmp.len =
             (size_t)internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*
                               ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_)
        ;
        data = CBS_data((CBS *)&srtp_mki.len);
        sVar3 = CBS_len((CBS *)&srtp_mki.len);
        CBS_init((CBS *)local_a8,data,sVar3);
        while (sVar3 = CBS_len((CBS *)local_a8), sVar3 != 0) {
          iVar2 = CBS_get_u16((CBS *)local_a8,&local_aa);
          if (iVar2 == 0) {
            return false;
          }
          if (*(ulong *)(profile_ids_tmp.len + 8) == (ulong)local_aa) {
            *(size_t *)(ssl_00->handshake_func + 0x280) = profile_ids_tmp.len;
            return true;
          }
        }
        internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator++
                  ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_);
      }
      hs_local._7_1_ = true;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  // DTLS-SRTP is only defined for DTLS.
  if (contents == NULL || !SSL_is_dtls(ssl)) {
    return true;
  }

  CBS profile_ids, srtp_mki;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||
      CBS_len(&profile_ids) < 2 ||
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }
  // Discard the MKI value for now.

  const STACK_OF(SRTP_PROTECTION_PROFILE) *server_profiles =
      SSL_get_srtp_profiles(ssl);

  // Pick the server's most preferred profile.
  for (const SRTP_PROTECTION_PROFILE *server_profile : server_profiles) {
    CBS profile_ids_tmp;
    CBS_init(&profile_ids_tmp, CBS_data(&profile_ids), CBS_len(&profile_ids));

    while (CBS_len(&profile_ids_tmp) > 0) {
      uint16_t profile_id;
      if (!CBS_get_u16(&profile_ids_tmp, &profile_id)) {
        return false;
      }

      if (server_profile->id == profile_id) {
        ssl->s3->srtp_profile = server_profile;
        return true;
      }
    }
  }

  return true;
}